

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O1

void canonic_sampling(uint blocks)

{
  Histogram<unsigned_int> histogram;
  FixedDegreeNetwork network;
  CanonicSampler sampler;
  Random rng;
  string local_2890;
  string local_2870;
  Histogram<unsigned_int> local_2850;
  Network local_2820;
  CanonicSampler local_2798;
  Random local_2768;
  
  FixedDegreeNetwork::FixedDegreeNetwork((FixedDegreeNetwork *)&local_2820,3,blocks);
  Histogram<unsigned_int>::Histogram
            (&local_2850,0,local_2820.total_triangles / 3,local_2820.total_triangles / 3 + 1);
  Random::Random(&local_2768,2);
  local_2798.super_UniformSampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_0010dd58;
  local_2798.beta = 1.0;
  local_2798.super_UniformSampler.super_Sampler.rng = &local_2768;
  local_2798.super_UniformSampler.super_Sampler.histogram = &local_2850;
  local_2798.super_UniformSampler.proposer.rng = &local_2768;
  local_2798.super_UniformSampler.network = &local_2820;
  CanonicSampler::sample(&local_2798,1000000);
  local_2890._M_dataplus._M_p = (pointer)&local_2890.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2890,"canonic_%d.dat","");
  format(&local_2870,&local_2890,blocks);
  Histogram<unsigned_int>::export_histogram(&local_2850,&local_2870);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2870._M_dataplus._M_p != &local_2870.field_2) {
    operator_delete(local_2870._M_dataplus._M_p,local_2870.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2890._M_dataplus._M_p != &local_2890.field_2) {
    operator_delete(local_2890._M_dataplus._M_p,local_2890.field_2._M_allocated_capacity + 1);
  }
  std::random_device::_M_fini();
  local_2850._vptr_Histogram = (_func_int **)&PTR_v_0010dd10;
  if (local_2850._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2850._histogram.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2850._histogram.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2850._histogram.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2820.triangle_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.triangle_count.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.triangle_count.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.triangle_count.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_2820.links);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2820.backwards_list._M_h);
  if (local_2820.node_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.node_list.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.node_list.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.node_list.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void canonic_sampling(unsigned int blocks) {
    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(),
                                      network.get_triangles() + 1);
    Random rng(2);

    double beta = 1;
    CanonicSampler sampler(rng, histogram, network, beta);
    sampler.sample(1000000);
    histogram.export_histogram(format("canonic_%d.dat", blocks));
}